

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus StoreFrame(int frame_num,uint32_t min_size,MemBuffer *mem,Frame *frame)

{
  int iVar1;
  VP8StatusCode VVar2;
  size_t sVar3;
  ulong uVar4;
  MemBuffer *pMVar5;
  Frame *in_RCX;
  MemBuffer *in_RDX;
  uint in_ESI;
  int in_EDI;
  bool bVar6;
  VP8StatusCode vp8_status;
  WebPBitstreamFeatures features;
  size_t chunk_size;
  size_t payload_available;
  uint32_t payload_size_padded;
  uint32_t payload_size;
  uint32_t fourcc;
  size_t chunk_start_offset;
  ParseStatus status;
  int done;
  int image_chunks;
  int alpha_chunks;
  uint in_stack_ffffffffffffff58;
  uint uVar7;
  MemBuffer *in_stack_ffffffffffffff60;
  size_t local_98;
  WebPBitstreamFeatures local_80;
  size_t local_58;
  size_t local_50;
  uint local_44;
  uint32_t local_40;
  uint32_t local_3c;
  size_t local_38;
  ParseStatus local_30;
  int local_2c;
  int local_28;
  int local_24;
  Frame *local_20;
  MemBuffer *local_18;
  uint local_c;
  int local_8;
  ParseStatus local_4;
  
  local_24 = 0;
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  sVar3 = MemDataSize(in_RDX);
  bVar6 = true;
  if (7 < sVar3) {
    sVar3 = MemDataSize(local_18);
    bVar6 = sVar3 < local_c;
  }
  local_30 = PARSE_OK;
  if (bVar6) {
    local_4 = PARSE_NEED_MORE_DATA;
  }
  else {
    local_2c = 0;
    do {
      local_38 = local_18->start;
      local_3c = ReadLE32(in_stack_ffffffffffffff60);
      local_40 = ReadLE32(in_stack_ffffffffffffff60);
      if (0xfffffff6 < local_40) {
        return PARSE_ERROR;
      }
      local_44 = local_40 + (local_40 & 1);
      uVar4 = (ulong)local_44;
      sVar3 = MemDataSize(local_18);
      if (sVar3 < uVar4) {
        local_98 = MemDataSize(local_18);
        uVar7 = in_stack_ffffffffffffff58;
      }
      else {
        local_98 = (size_t)local_44;
        uVar7 = in_stack_ffffffffffffff58;
      }
      local_50 = local_98;
      local_58 = local_98 + 8;
      iVar1 = SizeIsInvalid(local_18,(ulong)local_44);
      if (iVar1 != 0) {
        return PARSE_ERROR;
      }
      in_stack_ffffffffffffff60 = (MemBuffer *)(ulong)local_44;
      pMVar5 = (MemBuffer *)MemDataSize(local_18);
      if (pMVar5 < in_stack_ffffffffffffff60) {
        local_30 = PARSE_NEED_MORE_DATA;
      }
      if (local_3c == 0x20385056) {
LAB_00109ea6:
        if (local_28 != 0) goto LAB_00109f6a;
        VVar2 = WebPGetFeatures((uint8_t *)in_stack_ffffffffffffff60,CONCAT44(local_3c,uVar7),
                                (WebPBitstreamFeatures *)0x109ed4);
        if ((local_30 == PARSE_NEED_MORE_DATA) && (VVar2 == VP8_STATUS_NOT_ENOUGH_DATA)) {
          return PARSE_NEED_MORE_DATA;
        }
        if (VVar2 != VP8_STATUS_OK) {
          return PARSE_ERROR;
        }
        local_28 = local_28 + 1;
        SetFrameInfo(local_38,local_58,local_8,(uint)(local_30 == PARSE_OK),&local_80,local_20);
        Skip(local_18,local_50);
      }
      else {
        if (local_3c == 0x48504c41) {
          if (local_24 == 0) {
            local_24 = 1;
            local_20->img_components[1].offset = local_38;
            local_20->img_components[1].size = local_58;
            local_20->has_alpha = 1;
            local_20->frame_num = local_8;
            Skip(local_18,local_50);
            goto LAB_00109f84;
          }
        }
        else if (local_3c == 0x4c385056) {
          if (0 < local_24) {
            return PARSE_ERROR;
          }
          goto LAB_00109ea6;
        }
LAB_00109f6a:
        Rewind(local_18,8);
        local_2c = 1;
      }
LAB_00109f84:
      if (local_18->start == local_18->riff_end) {
        local_2c = 1;
      }
      else {
        sVar3 = MemDataSize(local_18);
        if (sVar3 < 8) {
          local_30 = PARSE_NEED_MORE_DATA;
        }
      }
      in_stack_ffffffffffffff58 = uVar7 & 0xffffff;
      if (local_2c == 0) {
        in_stack_ffffffffffffff58 = CONCAT13(local_30 == PARSE_OK,(int3)uVar7);
      }
    } while ((char)(in_stack_ffffffffffffff58 >> 0x18) != '\0');
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

static ParseStatus StoreFrame(int frame_num, uint32_t min_size,
                              MemBuffer* const mem, Frame* const frame) {
  int alpha_chunks = 0;
  int image_chunks = 0;
  int done = (MemDataSize(mem) < CHUNK_HEADER_SIZE ||
              MemDataSize(mem) < min_size);
  ParseStatus status = PARSE_OK;

  if (done) return PARSE_NEED_MORE_DATA;

  do {
    const size_t chunk_start_offset = mem->start;
    const uint32_t fourcc = ReadLE32(mem);
    const uint32_t payload_size = ReadLE32(mem);
    uint32_t payload_size_padded;
    size_t payload_available;
    size_t chunk_size;

    if (payload_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

    payload_size_padded = payload_size + (payload_size & 1);
    payload_available = (payload_size_padded > MemDataSize(mem))
                      ? MemDataSize(mem) : payload_size_padded;
    chunk_size = CHUNK_HEADER_SIZE + payload_available;
    if (SizeIsInvalid(mem, payload_size_padded)) return PARSE_ERROR;
    if (payload_size_padded > MemDataSize(mem)) status = PARSE_NEED_MORE_DATA;

    switch (fourcc) {
      case MKFOURCC('A', 'L', 'P', 'H'):
        if (alpha_chunks == 0) {
          ++alpha_chunks;
          frame->img_components[1].offset = chunk_start_offset;
          frame->img_components[1].size = chunk_size;
          frame->has_alpha = 1;
          frame->frame_num = frame_num;
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
      case MKFOURCC('V', 'P', '8', 'L'):
        if (alpha_chunks > 0) return PARSE_ERROR;  // VP8L has its own alpha
        // fall through
      case MKFOURCC('V', 'P', '8', ' '):
        if (image_chunks == 0) {
          // Extract the bitstream features, tolerating failures when the data
          // is incomplete.
          WebPBitstreamFeatures features;
          const VP8StatusCode vp8_status =
              WebPGetFeatures(mem->buf + chunk_start_offset, chunk_size,
                              &features);
          if (status == PARSE_NEED_MORE_DATA &&
              vp8_status == VP8_STATUS_NOT_ENOUGH_DATA) {
            return PARSE_NEED_MORE_DATA;
          } else if (vp8_status != VP8_STATUS_OK) {
            // We have enough data, and yet WebPGetFeatures() failed.
            return PARSE_ERROR;
          }
          ++image_chunks;
          SetFrameInfo(chunk_start_offset, chunk_size, frame_num,
                       status == PARSE_OK, &features, frame);
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
 Done:
      default:
        // Restore fourcc/size when moving up one level in parsing.
        Rewind(mem, CHUNK_HEADER_SIZE);
        done = 1;
        break;
    }

    if (mem->start == mem->riff_end) {
      done = 1;
    } else if (MemDataSize(mem) < CHUNK_HEADER_SIZE) {
      status = PARSE_NEED_MORE_DATA;
    }
  } while (!done && status == PARSE_OK);

  return status;
}